

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

int __thiscall
chrono::ChSystemDescriptor::FromVectorToUnknowns
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  ChVariables *pCVar7;
  double *pdVar8;
  ChConstraint *pCVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int iVar16;
  uint uVar17;
  Index size;
  Index index;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  ChVectorRef local_48;
  
  iVar16 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar16;
  iVar16 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar16;
  if ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (long)iVar16 + (long)this->n_q) {
    __assert_fail("(n_q + n_c) == mvector.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x1ce,
                  "virtual int chrono::ChSystemDescriptor::FromVectorToUnknowns(const ChVectorDynamic<> &)"
                 );
  }
  ppCVar5 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar19 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar19 != 0) {
    lVar19 = lVar19 >> 3;
    lVar23 = 0;
    do {
      pCVar7 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar23];
      if (pCVar7->disabled == false) {
        uVar4 = pCVar7->offset;
        lVar24 = (long)(int)uVar4;
        uVar17 = (*pCVar7->_vptr_ChVariables[2])();
        pdVar8 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((int)uVar17 < 0 && pdVar8 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        if (((int)(uVar17 | uVar4) < 0) ||
           ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows - (long)(int)uVar17 < lVar24)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        ChVariables::Get_qb(&local_48,
                            (this->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar23]);
        if (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != (long)(int)uVar17) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                       );
        }
        uVar18 = local_48.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_;
        if (((local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ & 7) == 0) &&
           (uVar18 = (ulong)(-((uint)((ulong)local_48.
                                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                             ._0_8_ >> 3) & 0x1fffffff) & 7),
           (long)local_48.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_ <= (long)uVar18)) {
          uVar18 = local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_;
        }
        uVar21 = local_48.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_ - uVar18;
        uVar20 = uVar21 + 7;
        if (-1 < (long)uVar21) {
          uVar20 = uVar21;
        }
        if (0 < (long)uVar18) {
          uVar22 = 0;
          do {
            *(double *)
             (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + uVar22 * 8) = pdVar8[lVar24 + uVar22];
            uVar22 = uVar22 + 1;
          } while (uVar18 != uVar22);
        }
        uVar20 = (uVar20 & 0xfffffffffffffff8) + uVar18;
        if (7 < (long)uVar21) {
          do {
            pdVar1 = pdVar8 + lVar24 + uVar18;
            dVar3 = pdVar1[1];
            dVar10 = pdVar1[2];
            dVar11 = pdVar1[3];
            dVar12 = pdVar1[4];
            dVar13 = pdVar1[5];
            dVar14 = pdVar1[6];
            dVar15 = pdVar1[7];
            pdVar2 = (double *)
                     (local_48.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + uVar18 * 8);
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar3;
            pdVar2[2] = dVar10;
            pdVar2[3] = dVar11;
            pdVar2[4] = dVar12;
            pdVar2[5] = dVar13;
            pdVar2[6] = dVar14;
            pdVar2[7] = dVar15;
            uVar18 = uVar18 + 8;
          } while ((long)uVar18 < (long)uVar20);
        }
        if ((long)uVar20 <
            (long)local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_) {
          do {
            *(double *)
             (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + uVar20 * 8) = pdVar8[lVar24 + uVar20];
            uVar20 = uVar20 + 1;
          } while (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_ != uVar20);
        }
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar19 + (ulong)(lVar19 == 0));
  }
  if (ppCVar6 != ppCVar5) {
    lVar23 = (long)ppCVar6 - (long)ppCVar5 >> 3;
    ppCVar5 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar16 = this->n_q;
    pdVar8 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    lVar19 = 0;
    do {
      pCVar9 = ppCVar5[lVar19];
      if (pCVar9->active == true) {
        lVar24 = (long)pCVar9->offset + (long)iVar16;
        if (((int)lVar24 < 0) ||
           ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= lVar24)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        auVar25._0_8_ = -pdVar8[lVar24];
        auVar25._8_4_ = 0;
        auVar25._12_4_ = 0x80000000;
        dVar3 = (double)vmovlps_avx(auVar25);
        pCVar9->l_i = dVar3;
      }
      lVar19 = lVar19 + 1;
    } while (lVar23 + (ulong)(lVar23 == 0) != lVar19);
  }
  return this->n_c + this->n_q;
}

Assistant:

int ChSystemDescriptor::FromVectorToUnknowns(const ChVectorDynamic<>& mvector) {
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();

    assert((n_q + n_c) == mvector.size());

    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();

    // Fetch from the first part of vector (x.q = q)
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->Get_qb() = mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof());
        }
    }

    // Fetch from the second part of vector (x.l = -l), with flipped sign!
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->Set_l_i(-mvector(vconstraints[ic]->GetOffset() + n_q));
        }
    }

    return n_q + n_c;
}